

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertFloatsWithin
               (UNITY_FLOAT delta,UNITY_FLOAT expected,UNITY_FLOAT actual,char *msg,
               UNITY_UINT lineNumber)

{
  int iVar1;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    iVar1 = UnityFloatsWithin(delta,expected,actual);
    if (iVar1 != 0) {
      return;
    }
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected ");
    UnityPrintFloat(expected);
    UnityPrint(" Was ");
    UnityPrintFloat(actual);
    UnityAddMsgIfSpecified(msg);
    Unity.CurrentTestFailed = 1;
  }
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertFloatsWithin(const UNITY_FLOAT delta,
                             const UNITY_FLOAT expected,
                             const UNITY_FLOAT actual,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber)
{
    RETURN_IF_FAIL_OR_IGNORE;


    if (!UnityFloatsWithin(delta, expected, actual))
    {
        UnityTestResultsFailBegin(lineNumber);
        UNITY_PRINT_EXPECTED_AND_ACTUAL_FLOAT((UNITY_DOUBLE)expected, (UNITY_DOUBLE)actual);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}